

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.h
# Opt level: O0

void bitset_reset_range(uint64_t *words,uint32_t start,uint32_t end)

{
  uint uVar1;
  uint32_t i;
  uint32_t endword;
  uint32_t firstword;
  uint32_t end_local;
  uint32_t start_local;
  uint64_t *words_local;
  
  if (start != end) {
    i = start >> 6;
    uVar1 = end - 1 >> 6;
    if (i == uVar1) {
      words[i] = (-1L << ((byte)start & 0x3f) &
                  0xffffffffffffffffU >> (((byte)end ^ 0xff) + 1 & 0x3f) ^ 0xffffffffffffffff) &
                 words[i];
    }
    else {
      words[i] = (-1L << ((byte)start & 0x3f) ^ 0xffffffffffffffffU) & words[i];
      while (i = i + 1, i < uVar1) {
        words[i] = 0;
      }
      words[uVar1] = (0xffffffffffffffffU >> (((byte)end ^ 0xff) + 1 & 0x3f) ^ 0xffffffffffffffff) &
                     words[uVar1];
    }
  }
  return;
}

Assistant:

static inline void bitset_reset_range(uint64_t *words, uint32_t start,
                                      uint32_t end) {
    if (start == end) return;
    uint32_t firstword = start / 64;
    uint32_t endword = (end - 1) / 64;
    if (firstword == endword) {
        words[firstword] &= ~(((~UINT64_C(0)) << (start % 64)) &
                              ((~UINT64_C(0)) >> ((~end + 1) % 64)));
        return;
    }
    words[firstword] &= ~((~UINT64_C(0)) << (start % 64));
    for (uint32_t i = firstword + 1; i < endword; i++) {
        words[i] = UINT64_C(0);
    }
    words[endword] &= ~((~UINT64_C(0)) >> ((~end + 1) % 64));
}